

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_overlaph_graph.cpp
# Opt level: O3

void __thiscall
OveralGraphSupport_testSupportCalculationSimple_Test::
~OveralGraphSupport_testSupportCalculationSimple_Test
          (OveralGraphSupport_testSupportCalculationSimple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(OveralGraphSupport, testSupportCalculationSimple)
{
	// 		   4
	//		   |
  	// 0 ----- 1 ----- 2
  	// 		   |
  	//		   3
  	dgrminer::OverlapGraph overlapGraph(false);
  	for (int i = 0; i < 5; ++i) {
	  	overlapGraph.addVertex();
  	}

  	overlapGraph.addEdge(0, 1);
  	overlapGraph.addEdge(1, 2);
  	overlapGraph.addEdge(1, 4);
  	overlapGraph.addEdge(1, 3);

  	EXPECT_TRUE(equal(overlapGraph.computeSupport(), 4));
}